

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rollercoster.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  istream *piVar3;
  ostream *poVar4;
  ulong uVar5;
  bool bVar6;
  bool up;
  string line;
  ifstream stream;
  bool local_259;
  char *local_258;
  ulong local_250;
  char local_248 [16];
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238,argv[1],_S_in);
  local_258 = local_248;
  local_250 = 0;
  local_248[0] = '\0';
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_258,cVar1);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    local_259 = true;
    if (local_250 != 0) {
      bVar6 = true;
      uVar5 = 0;
      do {
        bVar2 = convert(local_258 + uVar5,&local_259);
        if (bVar2) {
          bVar6 = (bool)(bVar6 ^ 1);
          local_259 = bVar6;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < local_250);
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_258,local_250);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  std::ifstream::~ifstream(local_238);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);

    string line;
    bool up;
    while (getline(stream, line)) {
        up = true;

        for(int i = 0; i < line.size(); i++){
            bool tmp = convert(line[i],up);
            if(tmp)
                up = !up;

        }
        std::cout << line << std::endl;
    }
    return 0;
}